

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_sum(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
             lyxp_set *set,int options)

{
  lyxp_set_nodes *plVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  longdouble *__return_storage_ptr__;
  lyd_node *str_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  undefined1 local_98 [8];
  lyxp_set set_item;
  uint16_t i;
  char *str;
  longdouble num;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  set_fill_number(set,(longdouble)0);
  if ((*args)->type == LYXP_SET_EMPTY) {
    args_local._4_4_ = 0;
  }
  else if ((*args)->type == LYXP_SET_NODE_SET) {
    local_98._0_4_ = LYXP_SET_NODE_SET;
    set_item._8_8_ = malloc(0x10);
    if ((void *)set_item._8_8_ == (void *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","xpath_sum");
      args_local._4_4_ = -1;
    }
    else {
      set_item.val._8_4_ = 1;
      set_item.val._12_4_ = 1;
      for (set_item.ctx_size._2_2_ = 0; (uint)set_item.ctx_size._2_2_ < (*args)->used;
          set_item.ctx_size._2_2_ = set_item.ctx_size._2_2_ + 1) {
        plVar1 = ((*args)->val).nodes;
        *(lyd_node **)set_item._8_8_ = plVar1[set_item.ctx_size._2_2_].node;
        *(undefined8 *)(set_item._8_8_ + 8) = *(undefined8 *)&plVar1[set_item.ctx_size._2_2_].type;
        str_00 = cur_node;
        __return_storage_ptr__ =
             (longdouble *)cast_node_set_to_string((lyxp_set *)local_98,cur_node,param_4,options);
        if (__return_storage_ptr__ == (longdouble *)0x0) {
          return -1;
        }
        cast_string_to_number(__return_storage_ptr__,(char *)str_00);
        free(__return_storage_ptr__);
        (set->val).num = (set->val).num + in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
      }
      free((void *)set_item._8_8_);
      args_local._4_4_ = 0;
    }
  }
  else {
    pcVar2 = print_set_type(*args);
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar2,"sum(node-set)");
    args_local._4_4_ = -1;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_sum(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
          struct lyxp_set *set, int options)
{
    long double num;
    char *str;
    uint16_t i;
    struct lyxp_set set_item;

    set_fill_number(set, 0);
    if (args[0]->type == LYXP_SET_EMPTY) {
        return EXIT_SUCCESS;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "sum(node-set)");
        return -1;
    }

    set_item.type = LYXP_SET_NODE_SET;
    set_item.val.nodes = malloc(sizeof *set_item.val.nodes);
    if (!set_item.val.nodes) {
        LOGMEM;
        return -1;
    }

    set_item.used = 1;
    set_item.size = 1;

    for (i = 0; i < args[0]->used; ++i) {
        set_item.val.nodes[0] = args[0]->val.nodes[i];

        str = cast_node_set_to_string(&set_item, cur_node, local_mod, options);
        if (!str) {
            return -1;
        }
        num = cast_string_to_number(str);
        free(str);
        set->val.num += num;
    }

    free(set_item.val.nodes);

    return EXIT_SUCCESS;
}